

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
          (pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *this,size_type n)

{
  size_type sVar1;
  uint *__dest;
  size_type in_ESI;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint *temp;
  ebo *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  size_type sVar2;
  
  sVar2 = in_ESI;
  sVar1 = capacity(in_RDI);
  if (sVar1 < sVar2) {
    __dest = __gnu_cxx::new_allocator<unsigned_int>::allocate
                       ((new_allocator<unsigned_int> *)CONCAT44(sVar2,in_stack_ffffffffffffffe0),
                        (size_type)in_RDI,in_stack_ffffffffffffffd0);
    if ((in_RDI->ebo_).buf != (pointer)0x0) {
      in_stack_ffffffffffffffd0 = (ebo *)(in_RDI->ebo_).buf;
      sVar1 = size(in_RDI);
      memcpy(__dest,in_stack_ffffffffffffffd0,(ulong)sVar1 << 2);
    }
    ebo::release(in_stack_ffffffffffffffd0);
    (in_RDI->ebo_).buf = __dest;
    (in_RDI->ebo_).cap = in_ESI;
  }
  return;
}

Assistant:

void reserve(size_type n) {
		if (n > capacity()) {
			T* temp = ebo_.allocate(n);
			if (ebo_.buf) {
				std::memcpy(temp, ebo_.buf, size()*sizeof(T));
			}
			ebo_.release();
			ebo_.buf = temp;
			ebo_.cap = n;
		}
	}